

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

uint8_t * get_has_tr_table(PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  uint8_t *ret;
  BLOCK_SIZE bsize_local;
  PARTITION_TYPE partition_local;
  
  if ((partition == '\x06') || (partition == '\a')) {
    ret = has_tr_vert_tables[bsize];
  }
  else {
    ret = has_tr_tables[bsize];
  }
  return ret;
}

Assistant:

static const uint8_t *get_has_tr_table(PARTITION_TYPE partition,
                                       BLOCK_SIZE bsize) {
  const uint8_t *ret = NULL;
  // If this is a mixed vertical partition, look up bsize in orders_vert.
  if (partition == PARTITION_VERT_A || partition == PARTITION_VERT_B) {
    assert(bsize < BLOCK_SIZES);
    ret = has_tr_vert_tables[bsize];
  } else {
    ret = has_tr_tables[bsize];
  }
  assert(ret);
  return ret;
}